

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O0

any cs_impl::any::make_protect<cs::type_t,cs::struct_builder_const&,cs::type_id_const&>
              (struct_builder *args,type_id *args_1)

{
  holder<cs::type_t> *args_2;
  proxy *dat;
  int *in_RDX;
  allocator_type<cs_impl::any::proxy,_512UL,_cs_impl::default_allocator_provider> *in_RSI;
  proxy *in_RDI;
  proxy *ppVar1;
  struct_builder *in_stack_ffffffffffffffd8;
  undefined4 uVar2;
  undefined4 uVar3;
  
  uVar3 = 1;
  uVar2 = 1;
  ppVar1 = in_RDI;
  args_2 = cs::
           allocator_type<cs_impl::any::holder<cs::type_t>,64ul,cs_impl::default_allocator_provider>
           ::alloc<cs::struct_builder_const&,cs::type_id_const&>
                     ((allocator_type<cs_impl::any::holder<cs::type_t>,_64UL,_cs_impl::default_allocator_provider>
                       *)0x100000001,in_stack_ffffffffffffffd8,(type_id *)in_RDI);
  dat = cs::allocator_type<cs_impl::any::proxy,512ul,cs_impl::default_allocator_provider>::
        alloc<int,int,cs_impl::any::holder<cs::type_t>*>
                  (in_RSI,in_RDX,(int *)CONCAT44(uVar3,uVar2),(holder<cs::type_t> **)args_2);
  any((any *)in_RDI,dat);
  return (any)ppVar1;
}

Assistant:

static any make_protect(ArgsT &&...args)
		{
			return any(allocator.alloc(1, 1, holder<T>::allocator.alloc(std::forward<ArgsT>(args)...)));
		}